

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O1

ssize_t __thiscall
Dashel::SocketStream::send(SocketStream *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _func_int *p_Var1;
  ssize_t in_RAX;
  int *piVar2;
  undefined4 in_register_00000034;
  void *__buf_00;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  if ((this->super_DisconnectableStream).super_SelectableStream.fd < 0) {
    __assert_fail("fd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/dashel/dashel-posix.cpp"
                  ,0x1d7,"void Dashel::SocketStream::send(const void *, size_t)");
  }
  if (__buf != (void *)0x0) {
    do {
      in_RAX = ::send((this->super_DisconnectableStream).super_SelectableStream.fd,__buf_00,
                      (size_t)__buf,0x4000);
      if (in_RAX < 0) {
        p_Var1 = (this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream
                 [-3];
        piVar2 = __errno_location();
        Stream::fail((Stream *)
                     ((long)&(this->super_DisconnectableStream).super_SelectableStream.
                             _vptr_SelectableStream + (long)p_Var1),IOError,*piVar2,
                     "Socket write I/O error.");
      }
      if (in_RAX == 0) {
        Stream::fail((Stream *)
                     ((long)&(this->super_DisconnectableStream).super_SelectableStream.
                             _vptr_SelectableStream +
                     (long)(this->super_DisconnectableStream).super_SelectableStream.
                           _vptr_SelectableStream[-3]),ConnectionLost,0,"Connection lost.");
      }
      __buf_00 = (void *)((long)__buf_00 + in_RAX);
      __buf = (void *)((long)__buf - in_RAX);
    } while (__buf != (void *)0x0);
  }
  return in_RAX;
}

Assistant:

void send(const void* data, size_t size)
		{
			assert(fd >= 0);

			unsigned char* ptr = (unsigned char*)data;
			size_t left = size;

			while (left)
			{
#ifdef MACOSX
				ssize_t len = ::send(fd, ptr, left, 0);
#else
				ssize_t len = ::send(fd, ptr, left, MSG_NOSIGNAL);
#endif

				if (len < 0)
				{
					fail(DashelException::IOError, errno, "Socket write I/O error.");
				}
				else if (len == 0)
				{
					fail(DashelException::ConnectionLost, 0, "Connection lost.");
				}
				else
				{
					ptr += len;
					left -= len;
				}
			}
		}